

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O3

uint duckdb::Cast::Operation<unsigned_char,unsigned_int>(uchar input)

{
  bool bVar1;
  InvalidInputException *this;
  uchar input_00;
  uint result;
  uint local_3c;
  string local_38;
  
  bVar1 = TryCast::Operation<unsigned_char,unsigned_int>(input,&local_3c,false);
  if (bVar1) {
    return local_3c;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<unsigned_char,unsigned_int>(&local_38,(duckdb *)(ulong)input,input_00);
  InvalidInputException::InvalidInputException(this,&local_38);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}